

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void av1_lowbd_inv_txfm2d_add_v_identity_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int col;
  char *pcVar4;
  code *pcVar5;
  int out_size;
  int iVar6;
  ulong uVar7;
  int stride_00;
  undefined7 in_register_00000081;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  __m128i *palVar11;
  __m128i *palVar12;
  int iVar13;
  uint uVar14;
  uint8_t *output_00;
  bool bVar15;
  uint8_t *local_8f8;
  __m128i temp [8];
  __m128i buf1 [64];
  __m128i buf0 [64];
  
  uVar7 = CONCAT71(in_register_00000081,tx_size) & 0xffffffff;
  iVar6 = tx_size_high[uVar7];
  stride_00 = 0x20;
  if (iVar6 < 0x20) {
    stride_00 = iVar6;
  }
  uVar1 = eob_fill[(eob + -1) / stride_00];
  if (eob < stride_00) {
    iVar13 = eob_fill[eob + -1];
  }
  else {
    iVar13 = stride_00 + -1;
  }
  pcVar4 = av1_inv_txfm_shift_ls[uVar7];
  uVar7 = (ulong)(uint)((int)CONCAT71(in_register_00000081,tx_size) << 2);
  iVar2 = *(int *)((long)tx_size_wide_log2 + uVar7);
  iVar3 = *(int *)((long)tx_size_high_log2 + uVar7);
  col = *(int *)((long)tx_size_wide + uVar7);
  uVar10 = col >> 3;
  out_size = (uVar1 & 0xfffffff8) + 8;
  uVar14 = iVar13 + 8 >> 3;
  iVar6 = get_rect_tx_log_ratio(col,iVar6);
  pcVar5 = *(code **)((ulong)""[tx_type] * 0x20 + (long)iVar2 * 0x60 + 0x54df50 +
                     (long)lowbd_txfm_all_1d_zeros_idx[(int)uVar1] * 8);
  uVar9 = 0;
  uVar7 = 0;
  if (0 < (int)uVar10) {
    uVar7 = (ulong)uVar10;
  }
  if ((int)uVar14 < 1) {
    uVar14 = 0;
  }
  local_8f8 = output;
  for (; palVar12 = buf0, uVar9 != uVar14; uVar9 = uVar9 + 1) {
    load_buffer_32bit_to_16bit(input + uVar9 * 8,stride_00,palVar12,out_size);
    if ((iVar6 == 1) || (iVar6 == -1)) {
      round_shift_ssse3(palVar12,palVar12,out_size);
    }
    (*pcVar5)(palVar12,palVar12);
    round_shift_16bit_ssse3(palVar12,col,(int)*pcVar4);
    uVar8 = uVar7;
    palVar11 = temp + (long)(int)uVar10 * 8;
    if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
      while (uVar8 != 0) {
        flip_buf_sse2(palVar12,temp,8);
        transpose_16bit_8x8(temp,palVar11);
        palVar12 = palVar12 + 8;
        uVar8 = uVar8 - 1;
        palVar11 = palVar11 + -8;
      }
    }
    else {
      palVar11 = buf1;
      while (bVar15 = uVar8 != 0, uVar8 = uVar8 - 1, bVar15) {
        transpose_16bit_8x8(palVar12,palVar11);
        palVar11 = palVar11 + 8;
        palVar12 = palVar12 + 8;
      }
    }
    palVar12 = buf1;
    uVar8 = uVar7;
    output_00 = local_8f8;
    while (bVar15 = uVar8 != 0, uVar8 = uVar8 - 1, bVar15) {
      iidentity_col_8xn_ssse3(output_00,stride,palVar12,(int)pcVar4[1],iVar3 + -2,eob);
      palVar12 = palVar12 + 8;
      output_00 = output_00 + 8;
    }
    local_8f8 = local_8f8 + (long)stride * 8;
  }
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_v_identity_ssse3(const int32_t *input,
                                               uint8_t *output, int stride,
                                               TX_TYPE tx_type, TX_SIZE tx_size,
                                               int eob) {
  __m128i buf1[64];
  int eobx, eoby;
  get_eobx_eoby_scan_v_identity(&eobx, &eoby, tx_size, eob);
  const int8_t *shift = av1_inv_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int txfm_size_col = tx_size_wide[tx_size];
  const int txfm_size_row = tx_size_high[tx_size];
  const int buf_size_w_div8 = txfm_size_col >> 3;
  const int buf_size_nonzero_w = ((eobx + 8) >> 3) << 3;
  const int buf_size_h_div8 = (eoby + 8) >> 3;
  const int input_stride = AOMMIN(32, txfm_size_row);
  const int rect_type = get_rect_tx_log_ratio(txfm_size_col, txfm_size_row);

  const int fun_idx = lowbd_txfm_all_1d_zeros_idx[eobx];
  const transform_1d_ssse3 row_txfm =
      lowbd_txfm_all_1d_zeros_w8_arr[txw_idx][hitx_1d_tab[tx_type]][fun_idx];

  assert(row_txfm != NULL);
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  for (int i = 0; i < buf_size_h_div8; i++) {
    __m128i buf0[64];
    load_buffer_32bit_to_16bit(input + i * 8, input_stride, buf0,
                               buf_size_nonzero_w);
    if (rect_type == 1 || rect_type == -1) {
      round_shift_ssse3(buf0, buf0, buf_size_nonzero_w);  // rect special code
    }
    row_txfm(buf0, buf0);
    round_shift_16bit_ssse3(buf0, txfm_size_col, shift[0]);
    __m128i *_buf1 = buf1;
    if (lr_flip) {
      for (int j = 0; j < buf_size_w_div8; ++j) {
        __m128i temp[8];
        flip_buf_sse2(buf0 + 8 * j, temp, 8);
        transpose_16bit_8x8(temp, _buf1 + 8 * (buf_size_w_div8 - 1 - j));
      }
    } else {
      for (int j = 0; j < buf_size_w_div8; ++j) {
        transpose_16bit_8x8(buf0 + 8 * j, _buf1 + 8 * j);
      }
    }

    for (int j = 0; j < buf_size_w_div8; ++j) {
      iidentity_col_8xn_ssse3(output + i * 8 * stride + j * 8, stride,
                              buf1 + j * 8, shift[1], 8, txh_idx);
    }
  }
}